

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::Transform(ON_PolyCurve *this,ON_Xform *xform)

{
  ON_Curve *pOVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  ON_Object::TransformUserData((ON_Object *)this,xform);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  lVar4 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar2 = (uint)(0 < lVar4);
  lVar3 = 0;
  while ((lVar3 < lVar4 && ((uVar2 & 1) != 0))) {
    pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar3];
    uVar2 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar1,xform);
    lVar3 = lVar3 + 1;
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool
ON_PolyCurve::Transform( const ON_Xform& xform )
{
  TransformUserData(xform);
  DestroyRuntimeCache();
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->Transform( xform );
  }
  return rc;
}